

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangleShape.cpp
# Opt level: O1

Vector2f __thiscall sf::RectangleShape::getPoint(RectangleShape *this,size_t index)

{
  Vector2f VVar1;
  Vector2f VVar2;
  
  if (index == 3) {
    VVar2 = (Vector2f)((ulong)(uint)(this->m_size).y << 0x20);
  }
  else {
    if (index == 2) {
      return this->m_size;
    }
    VVar2.x = 0.0;
    VVar2.y = 0.0;
    if (index == 1) {
      VVar1.y = 0.0;
      VVar1.x = (this->m_size).x;
      return VVar1;
    }
  }
  return VVar2;
}

Assistant:

Vector2f RectangleShape::getPoint(std::size_t index) const
{
    switch (index)
    {
        default:
        case 0: return Vector2f(0, 0);
        case 1: return Vector2f(m_size.x, 0);
        case 2: return Vector2f(m_size.x, m_size.y);
        case 3: return Vector2f(0, m_size.y);
    }
}